

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O2

void __thiscall BamTools::Internal::BamToolsIndex::~BamToolsIndex(BamToolsIndex *this)

{
  ~BamToolsIndex(this);
  operator_delete(this);
  return;
}

Assistant:

BamToolsIndex::~BamToolsIndex(void) {
    CloseFile();
}